

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O1

int ReadTIFF(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  fwrite("TIFF support not compiled. Please install the libtiff development package before building.\n"
         ,0x5b,1,stderr);
  return 0;
}

Assistant:

int ReadTIFF(const uint8_t* const data, size_t data_size,
             struct WebPPicture* const pic, int keep_alpha,
             struct Metadata* const metadata) {
  (void)data;
  (void)data_size;
  (void)pic;
  (void)keep_alpha;
  (void)metadata;
  fprintf(stderr, "TIFF support not compiled. Please install the libtiff "
          "development package before building.\n");
  return 0;
}